

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageViewTests.cpp
# Opt level: O2

string * __thiscall
vkt::pipeline::(anonymous_namespace)::getComponentSwizzleCaseName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,
          VkComponentSwizzle componentSwizzle)

{
  char *__s;
  string local_50;
  string fullName;
  
  __s = ::vk::getComponentSwizzleName((VkComponentSwizzle)this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fullName,__s,(allocator<char> *)&local_50);
  std::__cxx11::string::substr((ulong)&local_50,(ulong)&fullName);
  de::toLower(__return_storage_ptr__,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&fullName);
  return __return_storage_ptr__;
}

Assistant:

static std::string getComponentSwizzleCaseName (VkComponentSwizzle componentSwizzle)
{
	const std::string fullName = getComponentSwizzleName(componentSwizzle);

	DE_ASSERT(de::beginsWith(fullName, "VK_COMPONENT_SWIZZLE_"));

	return de::toLower(fullName.substr(21));
}